

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeCurve::IsClosed(ON_PolyEdgeCurve *this)

{
  double t;
  double dVar1;
  ON_BrepEdge *this_00;
  ON_PolyEdgeSegment *this_01;
  bool bVar2;
  int iVar3;
  ON_Brep *pOVar4;
  ON_Brep *pOVar5;
  double *pdVar6;
  double dVar7;
  undefined1 local_90 [8];
  ON_Interval edom1;
  ON_Interval edom0;
  double et1;
  double local_48;
  double et0;
  int evi1;
  int evi0;
  ON_BrepEdge *edge1;
  ON_BrepEdge *edge0;
  ON_PolyEdgeSegment *seg1;
  ON_PolyEdgeSegment *seg0;
  ON_PolyEdgeCurve *pOStack_10;
  bool rc;
  ON_PolyEdgeCurve *this_local;
  
  pOStack_10 = this;
  seg0._7_1_ = ON_PolyCurve::IsClosed(&this->super_ON_PolyCurve);
  if ((!(bool)seg0._7_1_) && (iVar3 = SegmentCount(this), 1 < iVar3)) {
    seg1 = SegmentCurve(this,0);
    iVar3 = SegmentCount(this);
    edge0 = (ON_BrepEdge *)SegmentCurve(this,iVar3 + -1);
    edge1 = ON_PolyEdgeSegment::BrepEdge(seg1);
    _evi1 = ON_PolyEdgeSegment::BrepEdge((ON_PolyEdgeSegment *)edge0);
    if ((edge1 != (ON_BrepEdge *)0x0) && (_evi1 != (ON_BrepEdge *)0x0)) {
      pOVar4 = ON_BrepEdge::Brep(edge1);
      pOVar5 = ON_BrepEdge::Brep(_evi1);
      if (pOVar4 == pOVar5) {
        bVar2 = ON_PolyEdgeSegment::ReversedEdgeDir(seg1);
        et0._4_4_ = (uint)bVar2;
        bVar2 = ON_PolyEdgeSegment::ReversedEdgeDir((ON_PolyEdgeSegment *)edge0);
        this_01 = seg1;
        et0._0_4_ = (uint)!bVar2;
        (*(seg1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])();
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&et1,0);
        local_48 = ON_PolyEdgeSegment::EdgeParameter(this_01,*pdVar6);
        this_00 = edge0;
        (*(edge0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])();
        pdVar6 = ON_Interval::operator[]((ON_Interval *)(edom0.m_t + 1),1);
        t = ON_PolyEdgeSegment::EdgeParameter((ON_PolyEdgeSegment *)this_00,*pdVar6);
        if ((local_48 != -1.23432101234321e+308) || (NAN(local_48))) {
          dVar7 = -1.23432101234321e+308;
          if ((t != -1.23432101234321e+308) || (NAN(t))) {
            (*(edge1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x25])();
            edom0.m_t[0] = dVar7;
            (*(_evi1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x25])();
            dVar1 = local_48;
            edom1.m_t[0] = dVar7;
            pdVar6 = ON_Interval::operator[]((ON_Interval *)(edom1.m_t + 1),et0._4_4_);
            if ((dVar1 == *pdVar6) && (!NAN(dVar1) && !NAN(*pdVar6))) {
              pdVar6 = ON_Interval::operator[]((ON_Interval *)local_90,et0._0_4_);
              if ((t == *pdVar6) && (!NAN(t) && !NAN(*pdVar6))) {
                if (edge1->m_vi[(int)et0._4_4_] == _evi1->m_vi[(int)et0._0_4_]) {
                  seg0._7_1_ = 1;
                }
                goto LAB_00805d97;
              }
            }
            if ((((edge1 == _evi1) && (ABS(local_48 - t) <= 2.3283064365386963e-10)) &&
                (bVar2 = ON_Interval::Includes((ON_Interval *)(edom1.m_t + 1),local_48,true), bVar2)
                ) && (bVar2 = ON_Interval::Includes((ON_Interval *)local_90,t,true), bVar2)) {
              seg0._7_1_ = 1;
            }
          }
        }
      }
    }
  }
LAB_00805d97:
  return (bool)(seg0._7_1_ & 1);
}

Assistant:

bool ON_PolyEdgeCurve::IsClosed(void) const
{
  bool rc = ON_PolyCurve::IsClosed();

  if ( !rc && SegmentCount() > 1 )
  {
    // Since the segments that make up a ON_PolyEdgeCurve
    // cannot have their ends matched (because the curves
    // belong to objects already in the rhino model),
    // the IsClosed() test has to tolerate larger gaps
    // in brep topology.
    //
    // If the start and end segments are edges that belong
    // to the same brep, then they "join" if and only if 
    // they share a vertex.
    const ON_PolyEdgeSegment* seg0 = SegmentCurve(0);
    const ON_PolyEdgeSegment* seg1 = SegmentCurve(SegmentCount()-1);

    const ON_BrepEdge* edge0 = seg0->BrepEdge();
    const ON_BrepEdge* edge1 = seg1->BrepEdge();
    
    if ( edge0 && edge1 && edge0->Brep() == edge1->Brep() )
    {
      // check for topological closure
      //
      // Do NOT add a test for sloppy geometric closure here.
      // If the edges are in the same brep and they don't 
      // meet topologically, then there is something in the
      // brep that is separating the edges.
      int evi0 = seg0->ReversedEdgeDir() ? 1 : 0;
      int evi1 = seg1->ReversedEdgeDir() ? 0 : 1;
      double et0 = seg0->EdgeParameter(seg0->Domain()[0]);
      double et1 = seg1->EdgeParameter(seg1->Domain()[1]);
      if ( et0 != ON_UNSET_VALUE && et1 != ON_UNSET_VALUE )
      {
        ON_Interval edom0 = edge0->Domain();
        ON_Interval edom1 = edge1->Domain();
        if ( et0 == edom0[evi0] && et1 == edom1[evi1] )
        {
          // The polyedge starts at the (evi0?end:start) of edge0
          // and ends at the (ev1?end:start) of edge1.
          if ( edge0->m_vi[evi0] == edge1->m_vi[evi1] )
          {
            // the polyedge start/ends at a common vertex
            rc = true;
          }
        }
        else if ( edge0 == edge1 
                  && fabs(et0-et1) <= ON_ZERO_TOLERANCE 
                  && edom0.Includes(et0,true)
                  && edom1.Includes(et1,true)
                  )
        {
          // The start/end of the polyedge is an interior point
          // of a single edge.  (This happens when the "seam" gets
          // adjusted to be inside of an edge.)  It is unlikely that
          // ON_PolyCurve::IsClosed() would return false in this
          // case, but this check should keep everybody happy.
          rc = true;
        }
      }
    }
  }

  return rc;
}